

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FieldDescriptor::DebugString
          (FieldDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options
          )

{
  __pointer_type buffer;
  byte bVar1;
  __atomic_base<unsigned_long> __s;
  ushort *puVar2;
  char *pcVar3;
  FeatureSet *from;
  _Alloc_hider _Var4;
  atomic<char_*> aVar5;
  CleanupNode *debug_string_options_00;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  Descriptor *pDVar10;
  DescriptorNames *pDVar11;
  Nonnull<char_*> pcVar12;
  Nonnull<const_char_*> pcVar13;
  undefined1 *b;
  OneofDescriptor *pOVar14;
  char *pcVar15;
  uint value;
  int iVar16;
  ulong uVar17;
  undefined4 in_register_00000034;
  Arena *pAVar18;
  size_t in_R9;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view src;
  string formatted_options;
  string prefix;
  string label;
  string field_type;
  SourceLocationCommentPrinter comment_printer;
  FieldOptions full_options;
  undefined1 local_228 [56];
  Arena *local_1f0;
  __base_type local_1e8;
  undefined1 local_1e0 [16];
  string local_1d0;
  atomic<char_*> local_1b0;
  AllocatedData local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  CleanupNode *local_190;
  AllocatedData local_188;
  Arena *local_180;
  atomic<google::protobuf::internal::StringBlock_*> local_178;
  atomic<unsigned_long> local_170;
  undefined1 local_168 [8];
  undefined1 local_160 [24];
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  DebugStringOptions local_f8 [2];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_c8 [16];
  anon_union_136_1_493b367e_for_FieldOptions_38 local_b8;
  
  local_170.super___atomic_base<unsigned_long>._M_i._4_4_ = in_register_00000034;
  local_170.super___atomic_base<unsigned_long>._M_i._0_4_ = depth;
  local_1f0 = (Arena *)local_1e0;
  std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)depth * '\x02');
  local_1b0._M_b._M_p = (__base_type)&local_1a0;
  local_1a8.flat = (KeyValue *)0x0;
  local_1a0 = 0;
  if ((this->type_ == '\v') &&
     (pDVar10 = message_type(this), (pDVar10->options_->field_0)._impl_.map_entry_ == true)) {
    pDVar10 = message_type(this);
    if ((long)pDVar10->field_count_ < 1) {
      pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (0,(long)pDVar10->field_count_,"index < field_count()");
    }
    else {
      pcVar13 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar13 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar13);
      goto LAB_0015909c;
    }
    FieldTypeNameDebugString_abi_cxx11_((string *)local_c8,pDVar10->fields_);
    uVar7 = local_c8._8_8_;
    uVar6 = local_c8._0_8_;
    pDVar10 = message_type(this);
    if ((long)pDVar10->field_count_ < 2) {
      pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)pDVar10->field_count_,"index < field_count()");
    }
    else {
      pcVar13 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar13 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar13);
      goto LAB_0015909c;
    }
    FieldTypeNameDebugString_abi_cxx11_((string *)local_228,pDVar10->fields_ + 1);
    local_168 = (undefined1  [8])uVar7;
    local_160._0_8_ = uVar6;
    local_160._8_8_ = local_228._8_8_;
    local_160._16_8_ = local_228._0_8_;
    format._M_str = local_168;
    format._M_len = (size_t)"map<$0, $1>";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)&local_1b0,(Nonnull<std::string_*>)0xb,format,
               (Nullable<const_absl::string_view_*>)0x2,in_R9);
    if ((ThreadSafeArena *)local_228._0_8_ != (ThreadSafeArena *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
    }
    if ((__pointer_type)local_c8._0_8_ != (__pointer_type)(local_c8 + 0x10)) goto LAB_00158948;
  }
  else {
    FieldTypeNameDebugString_abi_cxx11_((string *)local_168,this);
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)local_168);
    local_b8._impl_._extensions_.arena_ = (Arena *)local_160._8_8_;
    local_c8._0_8_ = local_168;
    if (local_168 != (undefined1  [8])(local_160 + 8)) {
LAB_00158948:
      operator_delete((void *)local_c8._0_8_,
                      (ulong)((long)&((local_b8._impl_._extensions_.arena_)->impl_).tag_and_id_ + 1)
                     );
    }
  }
  b = kLabelToName;
  __s._M_i = *(__int_type_conflict *)(kLabelToName + (ulong)((byte)this->field_0x1 >> 6) * 8);
  local_168 = (undefined1  [8])strlen((char *)__s._M_i);
  local_c8._0_8_ = (__pointer_type)0x1;
  local_c8._8_8_ = (long)"\n " + 1;
  local_160._0_8_ = __s._M_i;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)(local_1e0 + 0x10),(lts_20250127 *)local_168,(AlphaNum *)local_c8,
             (AlphaNum *)b);
  if ((this->type_ == '\v') &&
     (pDVar10 = message_type(this), (pDVar10->options_->field_0)._impl_.map_entry_ != false)) {
LAB_00158a45:
    local_1d0._M_string_length = 0;
    *local_1d0._M_dataplus._M_p = '\0';
  }
  else {
    if ((this->field_0x3 & 1) != 0) {
      if ((this->field_0x1 & 0x10) == 0) {
        pOVar14 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar14 = (this->scope_).containing_oneof;
        if (pOVar14 == (OneofDescriptor *)0x0) {
          iVar16 = 0xb31;
          goto LAB_00159152;
        }
      }
      if (pOVar14 == (OneofDescriptor *)0x0) {
        iVar16 = 0xb63;
LAB_00159152:
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,iVar16);
      }
      if ((pOVar14->field_count_ == 1) && ((pOVar14->fields_->field_0x1 & 2) != 0)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_168,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb64,"!res->is_synthetic()");
        goto LAB_0015909c;
      }
      if ((this->field_0x3 & 1) != 0) goto LAB_00158a45;
    }
    if ((this->merged_features_->field_0)._impl_.field_presence_ != 3) {
      bVar1 = this->field_0x1;
      bVar8 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 == bVar8) {
        pcVar13 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar8,0xbf < bVar1,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar13 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_168,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar13);
        goto LAB_0015909c;
      }
      if (((this->field_0x1 & 0x20) == 0) && (bVar8 = has_optional_keyword(this), !bVar8))
      goto LAB_00158a45;
    }
  }
  bVar1 = this->field_0x1;
  bVar8 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar8) {
    pcVar13 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar8,0xbf < bVar1,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar13 == (Nonnull<const_char_*>)0x0) {
    if (((this->field_0x1 & 0x20) == 0) && (999 < (int)this->file_->edition_)) {
      local_1d0._M_string_length = 0;
      *local_1d0._M_dataplus._M_p = '\0';
    }
    local_160._16_8_ = &local_140;
    local_148 = 0;
    local_140._M_local_buf[0] = '\0';
    local_130._M_p = (pointer)&local_120;
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    local_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8[0].include_comments = debug_string_options->include_comments;
    local_f8[0].elide_group_body = debug_string_options->elide_group_body;
    local_f8[0].elide_oneof_body = debug_string_options->elide_oneof_body;
    local_f0._M_p = (pointer)&local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_1f0,
               (Nonnull<char_*>)((long)&(local_1e8._M_p)->next_ + (long)&local_1f0->impl_));
    if (debug_string_options->include_comments == true) {
      bVar8 = GetSourceLocation(this,(SourceLocation *)local_160);
    }
    else {
      bVar8 = false;
    }
    local_168[0] = bVar8;
    anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)local_168,contents);
    aVar5._M_b._M_p = local_1b0._M_b._M_p;
    _Var4._M_p = local_1d0._M_dataplus._M_p;
    pAVar18 = local_1f0;
    local_188 = local_1a8;
    local_178._M_b._M_p = (__base_type)(__base_type)local_1e8._M_p;
    local_180 = (Arena *)local_1d0._M_string_length;
    local_190 = (CleanupNode *)debug_string_options;
    if (((int)this->file_->edition_ < 1000) && (this->type_ == '\n')) {
      pDVar10 = message_type(this);
      pDVar11 = &pDVar10->all_names_;
    }
    else {
      pDVar11 = &this->all_names_;
    }
    puVar2 = (ushort *)pDVar11->payload_;
    uVar17 = (ulong)*puVar2;
    buffer = (__pointer_type)(local_228 + 0x10);
    pcVar12 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        (this->number_,(Nonnull<char_*>)buffer);
    local_b8._40_8_ = (long)puVar2 + ~uVar17;
    local_228._0_8_ = pcVar12 + -(long)buffer;
    pcVar15 = local_c8;
    local_c8._0_8_ = local_178._M_b._M_p;
    local_c8._8_8_ = pAVar18;
    local_b8._impl_._extensions_.arena_ = local_180;
    local_b8._8_8_ = _Var4._M_p;
    local_b8._impl_._extensions_.map_ = local_188;
    local_b8._24_8_ = aVar5._M_b._M_p;
    format_00._M_str = pcVar15;
    format_00._M_len = (size_t)"$0$1$2 $3 = $4";
    local_228._8_8_ = buffer;
    local_b8._32_8_ = uVar17;
    local_b8._impl_.edition_defaults_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
         (void *)local_228._0_8_;
    local_b8._56_8_ = buffer;
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)contents,(Nonnull<std::string_*>)0xe,format_00,
               (Nullable<const_absl::string_view_*>)0x5,in_R9);
    if ((this->field_0x1 & 1) == 0) {
      bVar8 = false;
    }
    else {
      DefaultValueAsString_abi_cxx11_((string *)local_c8,this,true);
      pcVar15 = local_228;
      local_228._0_8_ = local_c8._8_8_;
      local_228._8_8_ = local_c8._0_8_;
      format_01._M_str = pcVar15;
      format_01._M_len = (size_t)" [default = $0";
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)contents,(Nonnull<std::string_*>)0xe,format_01,
                 (Nullable<const_absl::string_view_*>)0x1,in_R9);
      if ((__pointer_type)local_c8._0_8_ != (__pointer_type)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,
                        (ulong)((long)&((local_b8._impl_._extensions_.arena_)->impl_).tag_and_id_ +
                               1));
      }
      bVar8 = true;
    }
    if ((this->field_0x1 & 4) != 0) {
      if (bVar8) {
        std::__cxx11::string::append((char *)contents);
      }
      else {
        bVar8 = true;
        std::__cxx11::string::append((char *)contents);
      }
      std::__cxx11::string::append((char *)contents);
      pcVar3 = (this->all_names_).payload_;
      src._M_len = (long)pcVar3 - (ulong)*(ushort *)(pcVar3 + 0xc);
      src._M_str = pcVar15;
      absl::lts_20250127::CEscape_abi_cxx11_
                ((string *)local_c8,(lts_20250127 *)(ulong)*(ushort *)(pcVar3 + 0xe),src);
      std::__cxx11::string::_M_append((char *)contents,local_c8._0_8_);
      if ((__pointer_type)local_c8._0_8_ != (__pointer_type)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,
                        (ulong)((long)&((local_b8._impl_._extensions_.arena_)->impl_).tag_and_id_ +
                               1));
      }
      std::__cxx11::string::append((char *)contents);
    }
    FieldOptions::FieldOptions((FieldOptions *)local_c8,(Arena *)0x0,this->options_);
    from = this->proto_features_;
    if (from != (FeatureSet *)_FeatureSet_default_instance_) {
      local_b8._24_8_ = local_b8._24_8_ | 1;
      if (local_b8._impl_.features_ == (FeatureSet *)0x0) {
        pAVar18 = (Arena *)local_c8._8_8_;
        if ((local_c8._8_8_ & 1) != 0) {
          pAVar18 = *(Arena **)(local_c8._8_8_ & 0xfffffffffffffffe);
        }
        local_b8._impl_.features_ =
             (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar18);
      }
      FeatureSet::CopyFrom(local_b8._impl_.features_,from);
    }
    if ((~this->field_0x3 & 6) != 0) {
      value = (byte)this->field_0x3 >> 1 & 3;
      bVar9 = internal::ValidateEnum(value,(uint32_t *)&FieldOptions_CType_internal_data_);
      if (!bVar9) {
        __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldOptions_CType_internal_data_)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                      ,0x4804,
                      "void google::protobuf::FieldOptions::_internal_set_ctype(::google::protobuf::FieldOptions_CType)"
                     );
      }
      local_b8._24_8_ = local_b8._24_8_ | 4;
      local_b8._impl_.ctype_ = value;
    }
    local_228._8_8_ = 0;
    local_228[0x10] = '\0';
    iVar16 = (int)local_170.super___atomic_base<unsigned_long>._M_i;
    local_228._0_8_ = local_228 + 0x10;
    bVar9 = anon_unknown_24::FormatBracketedOptions
                      (iVar16,(Message *)local_c8,this->file_->pool_,(string *)local_228);
    debug_string_options_00 = local_190;
    if (bVar9) {
      std::__cxx11::string::append((char *)contents);
      bVar8 = true;
      std::__cxx11::string::_M_append((char *)contents,local_228._0_8_);
    }
    if (bVar8) {
      std::__cxx11::string::append((char *)contents);
    }
    if ((((int)this->file_->edition_ < 1000) && (this->type_ == '\n')) &&
       (*(bool *)((long)&debug_string_options_00->elem + 1) == false)) {
      pDVar10 = message_type(this);
      Descriptor::DebugString
                (pDVar10,iVar16,contents,(DebugStringOptions *)debug_string_options_00,false);
    }
    else {
      std::__cxx11::string::append((char *)contents);
    }
    anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)local_168,contents);
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
    }
    FieldOptions::~FieldOptions((FieldOptions *)local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_p != &local_120) {
      operator_delete(local_130._M_p,
                      CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._16_8_ != &local_140) {
      operator_delete((void *)local_160._16_8_,
                      CONCAT71(local_140._M_allocated_capacity._1_7_,local_140._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
    }
    if (local_1b0._M_b._M_p != (__base_type)&local_1a0) {
      operator_delete((void *)local_1b0._M_b._M_p,CONCAT71(uStack_19f,local_1a0) + 1);
    }
    if (local_1f0 != (Arena *)local_1e0) {
      operator_delete(local_1f0,local_1e0._0_8_ + 1);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_168,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,pcVar13);
LAB_0015909c:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_168);
}

Assistant:

void FieldDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  std::string field_type;

  // Special case map fields.
  if (is_map()) {
    absl::SubstituteAndAppend(
        &field_type, "map<$0, $1>",
        message_type()->field(0)->FieldTypeNameDebugString(),
        message_type()->field(1)->FieldTypeNameDebugString());
  } else {
    field_type = FieldTypeNameDebugString();
  }

  std::string label =
      absl::StrCat(kLabelToName[static_cast<Label>(label_)], " ");

  // Label is omitted for maps, oneof, and plain proto3 fields.
  if (is_map() || real_containing_oneof() ||
      (!is_required() && !is_repeated() && !has_optional_keyword())) {
    label.clear();
  }
  // Label is omitted for optional and required fields under editions.
  if (!is_repeated() && !IsLegacyEdition(file()->edition())) {
    label.clear();
  }

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(
      contents, "$0$1$2 $3 = $4", prefix, label, field_type,
      IsGroupSyntax(file()->edition(), this) ? message_type()->name() : name(),
      number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    absl::SubstituteAndAppend(contents, " [default = $0",
                              DefaultValueAsString(true));
  }
  if (has_json_name_) {
    if (!bracketed) {
      bracketed = true;
      contents->append(" [");
    } else {
      contents->append(", ");
    }
    contents->append("json_name = \"");
    contents->append(absl::CEscape(json_name()));
    contents->append("\"");
  }

  FieldOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  if (has_legacy_proto_ctype()) {
    full_options.set_ctype(
        static_cast<FieldOptions::CType>(legacy_proto_ctype()));
  }
  std::string formatted_options;
  if (FormatBracketedOptions(depth, full_options, file()->pool(),
                             &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (IsGroupSyntax(file()->edition(), this)) {
    if (debug_string_options.elide_group_body) {
      contents->append(" { ... };\n");
    } else {
      message_type()->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ false);
    }
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}